

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  Arena **__mutex;
  long *plVar1;
  char **ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Logger *info_log;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Iterator *iter;
  undefined4 extraout_var_00;
  long lVar8;
  Version *in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar9;
  Slice max_user_key;
  Slice min_user_key;
  FileMetaData meta;
  Slice local_c0;
  string local_b0;
  FileMetaData local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_90.smallest.rep_._M_dataplus._M_p = (pointer)&local_90.smallest.rep_.field_2;
  local_90.refs = 0;
  local_90.allowed_seeks = 0x40000000;
  local_90.file_size = 0;
  local_90.smallest.rep_._M_string_length = 0;
  local_90.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_90.largest.rep_._M_dataplus._M_p = (pointer)&local_90.largest.rep_.field_2;
  local_90.largest.rep_._M_string_length = 0;
  local_90.largest.rep_.field_2._M_local_buf[0] = '\0';
  lVar8 = *(long *)&mem[4].table_.max_height_;
  local_90.number = *(uint64_t *)(lVar8 + 0x48);
  *(uint64_t *)(lVar8 + 0x48) = local_90.number + 1;
  this_00 = &mem[4].arena_.blocks_;
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)this_00,&local_90.number);
  iter = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",local_90.number);
  __mutex = &mem[1].table_.arena_;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  BuildTable((leveldb *)&local_b0,(string *)&mem[1].arena_.blocks_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (TableCache *)mem[1].table_.compare_.comparator.super_Comparator._vptr_Comparator,iter,
             &local_90);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this->super_DB)._vptr_DB;
  (this->super_DB)._vptr_DB = (_func_int **)local_b0._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    operator_delete__(paVar3);
  }
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar5 = local_90.file_size;
  uVar4 = local_90.number;
  if (iVar7 == 0) {
    info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
    Status::ToString_abi_cxx11_(&local_b0,(Status *)this);
    Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar4,uVar5,local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (iter != (Iterator *)0x0) {
      (*iter->_vptr_Iterator[1])(iter);
    }
    pVar9 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)this_00,&local_90.number);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
    lVar8 = 0;
    if (((this->super_DB)._vptr_DB == (_func_int **)0x0) && (local_90.file_size != 0)) {
      if (local_90.smallest.rep_._M_string_length < 8) {
LAB_0066bfab:
        __assert_fail("internal_key.size() >= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
      }
      local_b0._M_string_length = local_90.smallest.rep_._M_string_length - 8;
      local_b0._M_dataplus._M_p = local_90.smallest.rep_._M_dataplus._M_p;
      if (local_90.largest.rep_._M_string_length < 8) goto LAB_0066bfab;
      local_c0.size_ = local_90.largest.rep_._M_string_length - 8;
      local_c0.data_ = local_90.largest.rep_._M_dataplus._M_p;
      if (in_R8 == (Version *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = Version::PickLevelForMemTableOutput(in_R8,(Slice *)&local_b0,&local_c0);
      }
      VersionEdit::AddFile
                ((VersionEdit *)base,iVar7,local_90.number,local_90.file_size,&local_90.smallest,
                 &local_90.largest);
      lVar8 = (long)iVar7;
    }
    iVar7 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
    plVar1 = (long *)((long)&mem[5].comparator_ + lVar8 * 0x18 + 8);
    *plVar1 = *plVar1 + (CONCAT44(extraout_var_00,iVar7) - CONCAT44(extraout_var,iVar6));
    ppcVar2 = &mem[5].arena_.alloc_ptr_ + lVar8 * 3;
    *ppcVar2 = *ppcVar2 + local_90.file_size;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.largest.rep_._M_dataplus._M_p != &local_90.largest.rep_.field_2) {
      operator_delete(local_90.largest.rep_._M_dataplus._M_p,
                      CONCAT71(local_90.largest.rep_.field_2._M_allocated_capacity._1_7_,
                               local_90.largest.rep_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.smallest.rep_._M_dataplus._M_p != &local_90.smallest.rep_.field_2) {
      operator_delete(local_90.smallest.rep_._M_dataplus._M_p,
                      CONCAT71(local_90.smallest.rep_.field_2._M_allocated_capacity._1_7_,
                               local_90.smallest.rep_.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_system_error(iVar7);
    goto LAB_0066bfab;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}